

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O2

void do_permonst(char *outfile)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  ulong uVar6;
  
  ofp = (FILE *)fopen(outfile,"w+");
  if ((FILE *)ofp == (FILE *)0x0) {
    perror(outfile);
    exit(1);
  }
  fputs("/* This source file is generated by \'makedefs\'.  Do not edit. */\n",(FILE *)ofp);
  fwrite("#ifndef PM_H\n#define PM_H\n",0x1a,1,(FILE *)ofp);
  iVar2 = strcmp("giant ant","playermon");
  if (iVar2 != 0) {
    fwrite("\n#define\tPM_PLAYERMON\t(-1)",0x1a,1,(FILE *)ofp);
  }
  uVar6 = 0;
  do {
    cVar1 = mons[uVar6].mlet;
    if (cVar1 == '\0') {
      fprintf((FILE *)ofp,"\n\n#define\tNUMMONS\t%d\n",uVar6 & 0xffffffff);
      fwrite("\n#endif /* PM_H */\n",0x13,1,(FILE *)ofp);
      fclose((FILE *)ofp);
      return;
    }
    fwrite("\n#define\tPM_",0xc,1,(FILE *)ofp);
    pcVar4 = mons[uVar6].mname;
    if (cVar1 == '5') {
      iVar2 = strncmp(pcVar4,"were",4);
      if (iVar2 == 0) {
        fwrite("HUMAN_",6,1,(FILE *)ofp);
      }
    }
    pcVar3 = tmpdup(pcVar4);
    for (pcVar4 = pcVar3; cVar1 = *pcVar4, cVar1 != '\0'; pcVar4 = pcVar4 + 1) {
      if ((byte)(cVar1 + 0x9fU) < 0x1a) {
        cVar5 = cVar1 + -0x20;
LAB_0010a3a5:
        *pcVar4 = cVar5;
      }
      else {
        cVar5 = '_';
        if ((byte)(cVar1 + 0xa5U) < 0xe6) goto LAB_0010a3a5;
      }
    }
    fprintf((FILE *)ofp,"%s\t%d",pcVar3,uVar6 & 0xffffffff);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void do_permonst(const char *outfile)
{
	int	i;
	char	*c, *nam;

	if (!(ofp = fopen(outfile, WRTMODE))) {
		perror(outfile);
		exit(EXIT_FAILURE);
	}
	
	fprintf(ofp,"%s", Dont_Edit_Code);
	fprintf(ofp,"#ifndef PM_H\n#define PM_H\n");

	if (strcmp(mons[0].mname, "playermon") != 0)
		fprintf(ofp,"\n#define\tPM_PLAYERMON\t(-1)");

	for (i = 0; mons[i].mlet; i++) {
		fprintf(ofp,"\n#define\tPM_");
		if (mons[i].mlet == S_HUMAN &&
				!strncmp(mons[i].mname, "were", 4))
		    fprintf(ofp, "HUMAN_");
		for (nam = c = tmpdup(mons[i].mname); *c; c++)
		    if (*c >= 'a' && *c <= 'z') *c -= (char)('a' - 'A');
		    else if (*c < 'A' || *c > 'Z') *c = '_';
		fprintf(ofp,"%s\t%d", nam, i);
	}
	fprintf(ofp,"\n\n#define\tNUMMONS\t%d\n", i);
	fprintf(ofp,"\n#endif /* PM_H */\n");
	fclose(ofp);
	return;
}